

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O2

bool __thiscall
snappy::SnappyScatteredWriter<snappy::SnappySinkAllocator>::SlowAppendFromSelf
          (SnappyScatteredWriter<snappy::SnappySinkAllocator> *this,size_t offset,size_t len)

{
  char *pcVar1;
  ulong uVar2;
  bool bVar3;
  char c;
  
  pcVar1 = this->op_ptr_ + (this->full_size_ - (long)this->op_base_);
  if (((char *)(offset - 1) < pcVar1) && (len <= this->expected_ - (long)pcVar1)) {
    uVar2 = (long)pcVar1 - offset;
    while (bVar3 = len != 0, len = len - 1, bVar3) {
      c = (this->blocks_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
          super__Vector_impl_data._M_start[uVar2 >> 0x10][uVar2 & 0xffff];
      Append(this,&c,1);
      uVar2 = uVar2 + 1;
    }
    bVar3 = true;
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

inline size_t Size() const {
    return full_size_ + (op_ptr_ - op_base_);
  }